

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_head.c
# Opt level: O2

void test_colnam(FILE *out,FitsHdu *hduptr)

{
  int iVar1;
  byte *pbVar2;
  undefined8 *puVar3;
  long lVar4;
  char **ppcVar5;
  byte bVar6;
  int iVar7;
  void *__ptr;
  char *pcVar8;
  __int32_t **pp_Var9;
  void *__base;
  undefined8 *puVar10;
  long lVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  size_t __nmemb;
  long lVar15;
  
  iVar1 = hduptr->ncols;
  __nmemb = (size_t)iVar1;
  if ((long)__nmemb < 1) {
    return;
  }
  __ptr = malloc(__nmemb * 8);
  ppcVar5 = ttype;
  for (sVar12 = 0; __nmemb != sVar12; sVar12 = sVar12 + 1) {
    pcVar8 = (char *)malloc(0x47);
    *(char **)((long)__ptr + sVar12 * 8) = pcVar8;
    strcpy(pcVar8,ppcVar5[sVar12]);
  }
  uVar14 = 0;
  while (uVar13 = uVar14, uVar13 != __nmemb) {
    pbVar2 = (byte *)ttype[uVar13];
    bVar6 = *pbVar2;
    if (bVar6 == 0) {
      uVar14 = uVar13 + 1;
      sprintf(errmes,"Column #%d has no name (No TTYPE%d keyword).",uVar14 & 0xffffffff,
              uVar14 & 0xffffffff);
      wrtwrn(out,errmes,0);
    }
    else {
      lVar11 = *(long *)((long)__ptr + uVar13 * 8);
      uVar14 = uVar13 + 1;
      lVar15 = 0;
      while (bVar6 != 0) {
        if ((((byte)(bVar6 - 0x3a) < 0xf6) && ((byte)((bVar6 & 0xdf) + 0xa5) < 0xe6)) &&
           (bVar6 != 0x5f)) {
          if (bVar6 == 0x26) {
            sprintf(errmes,
                    "Column #%d: Reserved column name keyword (TTYPE%d) may use an illegal CONTINUE (\'%c\')"
                    ,uVar14 & 0xffffffff,uVar14 & 0xffffffff,0x26);
          }
          else {
            sprintf(errmes,
                    "Column #%d: Name \"%s\" contains character \'%c\' other than letters, digits, and \"_\"."
                    ,uVar14 & 0xffffffff,ttype[uVar13],(ulong)(uint)(int)(char)bVar6);
          }
          wrtwrn(out,errmes,0);
        }
        bVar6 = pbVar2[lVar15];
        pp_Var9 = __ctype_toupper_loc();
        *(char *)(lVar11 + lVar15) = (char)(*pp_Var9)[(char)bVar6];
        lVar4 = lVar15 + 1;
        lVar15 = lVar15 + 1;
        bVar6 = pbVar2[lVar4];
      }
    }
  }
  __base = calloc(__nmemb,8);
  sVar12 = 0;
  while (__nmemb != sVar12) {
    puVar10 = (undefined8 *)malloc(0x10);
    *(undefined8 **)((long)__base + sVar12 * 8) = puVar10;
    *puVar10 = *(undefined8 *)((long)__ptr + sVar12 * 8);
    sVar12 = sVar12 + 1;
    *(int *)(puVar10 + 1) = (int)sVar12;
  }
  qsort(__base,__nmemb,8,compcol);
  for (uVar14 = 0; iVar1 - 1 != uVar14; uVar14 = uVar14 + 1) {
    puVar10 = *(undefined8 **)((long)__base + uVar14 * 8);
    pcVar8 = (char *)*puVar10;
    if (*pcVar8 != '\0') {
      puVar3 = *(undefined8 **)((long)__base + uVar14 * 8 + 8);
      iVar7 = strcmp(pcVar8,(char *)*puVar3);
      if (iVar7 == 0) {
        lVar11 = (long)*(int *)(puVar10 + 1);
        lVar15 = (long)*(int *)(puVar3 + 1);
        sprintf(errmes,"Columns #%d, %s and #%d, %s are not unique (case insensitive).",lVar11,
                ttype[lVar11 + -1],lVar15,ttype[lVar15 + -1]);
        wrtwrn(out,errmes,0);
      }
    }
  }
  for (sVar12 = 0; __nmemb != sVar12; sVar12 = sVar12 + 1) {
    free(*(void **)((long)__base + sVar12 * 8));
    free(*(void **)((long)__ptr + sVar12 * 8));
  }
  free(__base);
  free(__ptr);
  return;
}

Assistant:

void test_colnam(FILE *out, 
		FitsHdu *hduptr)
{ 
    int i,n; 
    char *p, *q;
    ColName **cols; 
    char **ttypecopy;

    n = hduptr->ncols; 

    if(n <= 0) return;
    /* make a local working copy of ttype */
    ttypecopy = (char **)malloc(n*sizeof(char *));
    for (i = 0; i < n; i++) { 
        ttypecopy[i] = (char *)malloc(FLEN_VALUE*sizeof(char));
        strcpy(ttypecopy[i],ttype[i]);
    } 

    /* check whether there are any other non ASCII-text characters 
      (FITS standard R14). Also "uppercase" the working copies. */
    for (i = 0; i < n; i++) { 
        p = ttype[i];
        q = ttypecopy[i];
        if(!strlen(p)) { 
            sprintf(errmes,
            "Column #%d has no name (No TTYPE%d keyword).",i+1, i+1);
            wrtwrn(out,errmes,0);
            continue;
        }


/*      disable this check (it was only a warning) 
        if( (*p  > 'z' || *p < 'a') && (*p > 'Z' || *p <'A') 
                && (*p > '9' || *p < '0') ) { 
            sprintf(errmes,"Column #%d: Name \"%s\" does not begin with a letter or a digit.",i+1,ttype[i]);
            wrtwrn(out,errmes,1);
        }  
*/
        while(*p != '\0') {
            if ((*p > 'z' || *p < 'a') && (*p > 'Z' || *p < 'A')
                 && (*p > '9' || *p < '0') && (*p != '_')) {
               if (*p == '&') {
                  sprintf(errmes,
                  "Column #%d: Reserved column name keyword (TTYPE%d) may use an illegal CONTINUE (\'%c\')",
                  i+1,i+1,*p);
                  wrtwrn(out,errmes,0);
               } else {
                  sprintf(errmes,
                  "Column #%d: Name \"%s\" contains character \'%c\' other than letters, digits, and \"_\".",
                  i+1,ttype[i],*p);
                  wrtwrn(out,errmes,0);
               }
            }
            if(*p <= 'z' || *p >= 'a') *q = toupper(*p);
            p++; q++;
        }
    }

    cols = (ColName **)calloc(n, sizeof(ColName *));
    for (i=0; i < n; i++) { 
        cols[i] = (ColName *)malloc(sizeof(ColName));
	cols[i]->name = ttypecopy[i];
	cols[i]->index = i+1; 
    }
    
    /* sort the column name in the ascending order of name field*/ 
    qsort(cols, n, sizeof(ColName *), compcol); 

    /* Check the duplication of the column name */ 
    for (i = 0; i < n-1; i++) { 
        if(!strlen(cols[i]->name)) continue;

/*      disable this warning
        if(!strncmp(cols[i]->name,cols[i+1]->name,16)) { 
            sprintf(errmes,
     "Columns #%d, %s and #%d, %s are not unique within first 16 characters(case insensitive).", 
            cols[i]->index,   ttype[(cols[i]->index-1)], 
            cols[i+1]->index, ttype[(cols[i+1]->index-1)]);
          wrtwrn(out,errmes,1);
        }
*/

        if(!strcmp(cols[i]->name,cols[i+1]->name)) { 
            sprintf(errmes,
     "Columns #%d, %s and #%d, %s are not unique (case insensitive).", 
            cols[i]->index,   ttype[(cols[i]->index-1)], 
            cols[i+1]->index, ttype[(cols[i+1]->index-1)]);
          wrtwrn(out,errmes,0);
        }
    }  
    for (i = 0; i < n; i++) { free(cols[i]); free(ttypecopy[i]);}
    free(cols); free(ttypecopy);
    return;
}